

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O2

void __thiscall CDoodadsMapper::AnalyzeGameLayer(CDoodadsMapper *this)

{
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  *this_00;
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  *this_01;
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  *this_02;
  CLayerGame *pCVar1;
  CTile *pCVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  EVP_PKEY_CTX *pEVar6;
  int i;
  int iVar7;
  bool bVar8;
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  *this_03;
  int y;
  int iVar9;
  long lVar10;
  long in_FS_OFFSET;
  bool bVar11;
  int local_98;
  int local_94;
  int local_8c;
  int local_78;
  int local_4c;
  array<int,_allocator_default<int>_> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_03 = &this->m_FloorIDs;
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  ::clear(this_03);
  this_00 = &this->m_CeilingIDs;
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  ::clear(this_00);
  this_01 = &this->m_RightWallIDs;
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  ::clear(this_01);
  this_02 = &this->m_LeftWallIDs;
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  ::clear(this_02);
  pCVar1 = (((this->super_IAutoMapper).m_pEditor)->m_Map).m_pGameLayer;
  pEVar6 = (EVP_PKEY_CTX *)0x1;
  local_8c = 0;
  local_78 = 2;
  local_94 = 0;
  local_98 = 0;
  while( true ) {
    iVar4 = (pCVar1->super_CLayerTiles).m_Height;
    iVar7 = (int)pEVar6;
    if (iVar4 + -1 <= iVar7) break;
    bVar8 = false;
    lVar10 = 1;
    bVar3 = false;
    while( true ) {
      iVar4 = (pCVar1->super_CLayerTiles).m_Width;
      iVar9 = (int)lVar10;
      if (iVar4 + -1 <= iVar9) break;
      pCVar2 = (pCVar1->super_CLayerTiles).m_pTiles;
      iVar5 = iVar7 * iVar4 + iVar9;
      if (pCVar2[iVar5].m_Index == '\x01') {
        bVar11 = (byte)(pCVar2[iVar4 * local_8c + iVar9].m_Index + 0x40) < 0x41;
        if (bVar11) {
          if (bVar3) {
            local_48.list._0_4_ = iVar5;
            array<int,_allocator_default<int>_>::add(this_03->list + local_94,(int *)&local_48);
          }
          else {
            array<int,_allocator_default<int>_>::init(&local_48,pEVar6);
            local_4c = (pCVar1->super_CLayerTiles).m_Width * iVar7 + iVar9;
            array<int,_allocator_default<int>_>::add(&local_48,&local_4c);
            local_94 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                       ::add(this_03,&local_48);
            allocator_default<int>::free_array
                      ((int *)CONCAT44(local_48.list._4_4_,(int)local_48.list));
          }
        }
        bVar3 = bVar11;
        if ((pCVar2[iVar5].m_Index == '\x01') &&
           (iVar4 = (pCVar1->super_CLayerTiles).m_Width,
           (byte)((pCVar1->super_CLayerTiles).m_pTiles[local_78 * iVar4 + lVar10].m_Index + 0x40) <
           0x41)) {
          if (bVar8) {
            local_48.list._0_4_ = iVar4 * iVar7 + iVar9;
            array<int,_allocator_default<int>_>::add(this_00->list + local_98,(int *)&local_48);
            bVar8 = true;
          }
          else {
            array<int,_allocator_default<int>_>::init(&local_48,pEVar6);
            local_4c = (pCVar1->super_CLayerTiles).m_Width * iVar7 + iVar9;
            array<int,_allocator_default<int>_>::add(&local_48,&local_4c);
            local_98 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                       ::add(this_00,&local_48);
            allocator_default<int>::free_array
                      ((int *)CONCAT44(local_48.list._4_4_,(int)local_48.list));
            bVar8 = true;
          }
        }
        else {
          bVar8 = false;
        }
      }
      else {
        bVar8 = false;
        bVar3 = false;
      }
      lVar10 = lVar10 + 1;
    }
    local_8c = local_8c + 1;
    local_78 = local_78 + 1;
    pEVar6 = (EVP_PKEY_CTX *)(ulong)(iVar7 + 1);
  }
  pEVar6 = (EVP_PKEY_CTX *)0x1;
  local_94 = 0;
  local_98 = 0;
  do {
    iVar7 = (int)pEVar6;
    if ((pCVar1->super_CLayerTiles).m_Width + -1 <= iVar7) {
      for (iVar4 = 0; iVar4 < (this->m_FloorIDs).num_elements; iVar4 = iVar4 + 1) {
        if (this_03->list[iVar4].num_elements < 3) {
          array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
          ::remove_index_fast(this_03,iVar4);
          iVar4 = iVar4 + -1;
        }
      }
      for (iVar4 = 0; iVar4 < (this->m_CeilingIDs).num_elements; iVar4 = iVar4 + 1) {
        if (this_00->list[iVar4].num_elements < 3) {
          array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
          ::remove_index_fast(this_00,iVar4);
          iVar4 = iVar4 + -1;
        }
      }
      for (iVar4 = 0; iVar4 < (this->m_RightWallIDs).num_elements; iVar4 = iVar4 + 1) {
        if (this_01->list[iVar4].num_elements < 3) {
          array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
          ::remove_index_fast(this_01,iVar4);
          iVar4 = iVar4 + -1;
        }
      }
      for (iVar4 = 0; iVar4 < (this->m_LeftWallIDs).num_elements; iVar4 = iVar4 + 1) {
        if (this_02->list[iVar4].num_elements < 3) {
          array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
          ::remove_index_fast(this_02,iVar4);
          iVar4 = iVar4 + -1;
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    bVar3 = false;
    bVar8 = false;
    for (iVar9 = 1; iVar9 < iVar4 + -1; iVar9 = iVar9 + 1) {
      pCVar2 = (pCVar1->super_CLayerTiles).m_pTiles;
      iVar5 = (pCVar1->super_CLayerTiles).m_Width * iVar9;
      iVar4 = iVar5 + iVar7;
      if (pCVar2[iVar4].m_Index == '\x01') {
        bVar11 = (byte)(pCVar2[(int)(iVar5 + iVar7 + 1U)].m_Index + 0x40) < 0x41;
        if (bVar11) {
          if (bVar3) {
            local_48.list._0_4_ = iVar4;
            array<int,_allocator_default<int>_>::add(this_01->list + local_94,(int *)&local_48);
          }
          else {
            array<int,_allocator_default<int>_>::init(&local_48,pEVar6);
            local_4c = (pCVar1->super_CLayerTiles).m_Width * iVar9 + iVar7;
            array<int,_allocator_default<int>_>::add(&local_48,&local_4c);
            local_94 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                       ::add(this_01,&local_48);
            allocator_default<int>::free_array
                      ((int *)CONCAT44(local_48.list._4_4_,(int)local_48.list));
          }
        }
        bVar3 = bVar11;
        if ((pCVar2[iVar4].m_Index != '\x01') ||
           (iVar4 = (pCVar1->super_CLayerTiles).m_Width * iVar9,
           0x40 < (byte)((pCVar1->super_CLayerTiles).m_pTiles[iVar7 + -1 + iVar4].m_Index + 0x40)))
        goto LAB_00182751;
        if (bVar8) {
          local_48.list._0_4_ = iVar4 + iVar7;
          array<int,_allocator_default<int>_>::add(this_02->list + local_98,(int *)&local_48);
          bVar8 = true;
        }
        else {
          array<int,_allocator_default<int>_>::init(&local_48,pEVar6);
          local_4c = (pCVar1->super_CLayerTiles).m_Width * iVar9 + iVar7;
          array<int,_allocator_default<int>_>::add(&local_48,&local_4c);
          local_98 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                     ::add(this_02,&local_48);
          allocator_default<int>::free_array
                    ((int *)CONCAT44(local_48.list._4_4_,(int)local_48.list));
          bVar8 = true;
        }
      }
      else {
        bVar3 = false;
LAB_00182751:
        bVar8 = false;
      }
      iVar4 = (pCVar1->super_CLayerTiles).m_Height;
    }
    pEVar6 = (EVP_PKEY_CTX *)(ulong)(iVar7 + 1U);
  } while( true );
}

Assistant:

void CDoodadsMapper::AnalyzeGameLayer()
{
	// the purpose of this is to detect game layer collision's edges to place doodads according to them

	// clear existing edges
	m_FloorIDs.clear();
	m_CeilingIDs.clear();
	m_RightWallIDs.clear();
	m_LeftWallIDs.clear();

	CLayerGame *pLayer = m_pEditor->m_Map.m_pGameLayer;

	bool FloorKeepChaining = false;
	bool CeilingKeepChaining = false;
	int FloorChainID = 0;
	int CeilingChainID = 0;

	// floors and ceilings
	// browse up to down
	for(int y = 1; y < pLayer->m_Height-1; y++)
	{
		FloorKeepChaining = false;
		CeilingKeepChaining = false;

		for(int x = 1; x < pLayer->m_Width-1; x++)
		{
			CTile *pTile = &(pLayer->m_pTiles[y*pLayer->m_Width+x]);

			// empty, skip
			if(pTile->m_Index == 0)
			{
				FloorKeepChaining = false;
				CeilingKeepChaining = false;
				continue;
			}

			// check up
			int CheckIndex = (y-1)*pLayer->m_Width+x;

			// add a floor part
			if(pTile->m_Index == 1 && (pLayer->m_pTiles[CheckIndex].m_Index == 0 || pLayer->m_pTiles[CheckIndex].m_Index > ENTITY_OFFSET))
			{
				// create an new chain
				if(!FloorKeepChaining)
				{
					array<int> aChain;
					aChain.add(y*pLayer->m_Width+x);
					FloorChainID = m_FloorIDs.add(aChain);
					FloorKeepChaining = true;
				}
				else
				{
					// keep chaining
					m_FloorIDs[FloorChainID].add(y*pLayer->m_Width+x);
				}
			}
			else
				FloorKeepChaining = false;

			// check down
			CheckIndex = (y+1)*pLayer->m_Width+x;

			// add a ceiling part
			if(pTile->m_Index == 1 && (pLayer->m_pTiles[CheckIndex].m_Index == 0 || pLayer->m_pTiles[CheckIndex].m_Index > ENTITY_OFFSET))
			{
				// create an new chain
				if(!CeilingKeepChaining)
				{
					array<int> aChain;
					aChain.add(y*pLayer->m_Width+x);
					CeilingChainID = m_CeilingIDs.add(aChain);
					CeilingKeepChaining = true;
				}
				else
				{
					// keep chaining
					m_CeilingIDs[CeilingChainID].add(y*pLayer->m_Width+x);
				}
			}
			else
				CeilingKeepChaining = false;
		}
	}

	bool RWallKeepChaining = false;
	bool LWallKeepChaining = false;
	int RWallChainID = 0;
	int LWallChainID = 0;

	// walls
	// browse left to right
	for(int x = 1; x < pLayer->m_Width-1; x++)
	{
		RWallKeepChaining = false;
		LWallKeepChaining = false;

		for(int y = 1; y < pLayer->m_Height-1; y++)
		{
			CTile *pTile = &(pLayer->m_pTiles[y*pLayer->m_Width+x]);

			if(pTile->m_Index == 0)
			{
				RWallKeepChaining = false;
				LWallKeepChaining = false;
				continue;
			}

			// check right
			int CheckIndex = y*pLayer->m_Width+(x+1);

			// add a right wall part
			if(pTile->m_Index == 1 && (pLayer->m_pTiles[CheckIndex].m_Index == 0 || pLayer->m_pTiles[CheckIndex].m_Index > ENTITY_OFFSET))
			{
				// create an new chain
				if(!RWallKeepChaining)
				{
					array<int> aChain;
					aChain.add(y*pLayer->m_Width+x);
					RWallChainID = m_RightWallIDs.add(aChain);
					RWallKeepChaining = true;
				}
				else
				{
					// keep chaining
					m_RightWallIDs[RWallChainID].add(y*pLayer->m_Width+x);
				}
			}
			else
				RWallKeepChaining = false;

			// check left
			CheckIndex = y*pLayer->m_Width+(x-1);

			// add a left wall part
			if(pTile->m_Index == 1 && (pLayer->m_pTiles[CheckIndex].m_Index == 0 || pLayer->m_pTiles[CheckIndex].m_Index > ENTITY_OFFSET))
			{
				// create an new chain
				if(!LWallKeepChaining)
				{
					array<int> aChain;
					aChain.add(y*pLayer->m_Width+x);
					LWallChainID = m_LeftWallIDs.add(aChain);
					LWallKeepChaining = true;
				}
				else
				{
					// keep chaining
					m_LeftWallIDs[LWallChainID].add(y*pLayer->m_Width+x);
				}
			}
			else
				LWallKeepChaining = false;
		}
	}

	// clean up too small chains
	for(int i = 0; i < m_FloorIDs.size(); i++)
	{
		if(m_FloorIDs[i].size() < 3)
		{
			m_FloorIDs.remove_index_fast(i);
			i--;
		}
	}

	for(int i = 0; i < m_CeilingIDs.size(); i++)
	{
		if(m_CeilingIDs[i].size() < 3)
		{
			m_CeilingIDs.remove_index_fast(i);
			i--;
		}
	}

	for(int i = 0; i < m_RightWallIDs.size(); i++)
	{
		if(m_RightWallIDs[i].size() < 3)
		{
			m_RightWallIDs.remove_index_fast(i);
			i--;
		}
	}

	for(int i = 0; i < m_LeftWallIDs.size(); i++)
	{
		if(m_LeftWallIDs[i].size() < 3)
		{
			m_LeftWallIDs.remove_index_fast(i);
			i--;
		}
	}
}